

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

int __thiscall
drace::detector::Fasttrack<std::shared_mutex>::init
          (Fasttrack<std::shared_mutex> *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Callback in_RCX;
  long in_RDX;
  ulong uVar2;
  void *in_R8;
  
  if (1 < (int)ctx) {
    uVar2 = 1;
    do {
      iVar1 = strcmp(*(char **)(in_RDX + uVar2 * 8),"--stats");
      if (iVar1 == 0) {
        this->log_flag = true;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (((ulong)ctx & 0xffffffff) != uVar2);
  }
  this->clb = in_RCX;
  this->clb_context = in_R8;
  return (int)CONCAT71((int7)((ulong)in_R8 >> 8),1);
}

Assistant:

bool init(int argc, const char** argv, Callback rc_clb, void* context) final {
    parse_args(argc, argv);
    clb = rc_clb;  // init callback
    clb_context = context;
    return true;
  }